

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  vec<16U,_float> *pvVar5;
  VectorInfo *pVVar6;
  vec<16U,_float> *pvVar7;
  double *pdVar8;
  vq_node *this_00;
  size_type sVar9;
  const_reference pvVar10;
  split_alternative_node_task_params *psVar11;
  void *pData_ptr;
  float fVar12;
  bool local_329;
  bool local_2b1;
  float local_2a4;
  float local_288;
  int local_254;
  insert_result local_248;
  pair<crnlib::vec<16U,_float>,_int> local_22c;
  pair<crnlib::vec<16U,_float>,_unsigned_int> local_1e8;
  uint local_1a4;
  vq_node *pvStack_1a0;
  uint j;
  vq_node *node;
  code *pcStack_190;
  uint i_1;
  undefined8 local_188;
  uint local_17c;
  undefined1 local_178 [4];
  uint task;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
  params;
  uint alternative_max_splits;
  uint alternative_node;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  uint local_124;
  uint local_120;
  uint splits;
  uint end_node;
  uint begin_node;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  node_queue;
  uint weight;
  vec<16U,_float> *v;
  double dStack_a0;
  uint i;
  double ttsum;
  vq_node root;
  uint num_tasks;
  bool generate_node_index_map_local;
  uint max_splits_local;
  uint size_local;
  uint *weights_local;
  vec<16U,_float> *vectors_local;
  tree_clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  this->m_vectors = vectors;
  root._103_1_ = generate_node_index_map;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfo,size,false);
  vector<crnlib::vec<16U,_float>_>::resize(&this->m_weightedVectors,size,false);
  vector<double>::resize(&this->m_weightedDotProducts,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfoLeft,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfoRight,size,false);
  vector<bool>::resize(&this->m_vectorComparison,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::resize
            (&this->m_nodes,max_splits << 2,false);
  vector<crnlib::vec<16U,_float>_>::clear(&this->m_codebook);
  if (pTask_pool == (task_pool *)0x0) {
    local_254 = 1;
  }
  else {
    uVar4 = task_pool::get_num_threads(pTask_pool);
    local_254 = uVar4 + 1;
  }
  root.m_unsplittable = (bool)(undefined1)local_254;
  root.m_alternative = (bool)local_254._1_1_;
  root.m_processed = (bool)local_254._2_1_;
  root._99_1_ = local_254._3_1_;
  vq_node::vq_node((vq_node *)&ttsum);
  root.m_total_weight._4_4_ = 0;
  dStack_a0 = 0.0;
  root.m_variance = (float)size;
  for (v._4_4_ = 0;
      uVar4 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::size
                        (&this->m_vectorsInfo), v._4_4_ < uVar4; v._4_4_ = v._4_4_ + 1) {
    pvVar5 = vectors + v._4_4_;
    pVVar6 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::operator[]
                       (&this->m_vectorsInfo,v._4_4_);
    pVVar6->index = v._4_4_;
    uVar1 = weights[v._4_4_];
    pVVar6 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::operator[]
                       (&this->m_vectorsInfo,v._4_4_);
    pVVar6->weight = uVar1;
    crnlib::operator*((vec<16U,_float> *)&node_queue.field_0x1c,pvVar5,(float)uVar1);
    pvVar7 = vector<crnlib::vec<16U,_float>_>::operator[](&this->m_weightedVectors,v._4_4_);
    vec<16U,_float>::operator=(pvVar7,(vec<16U,_float> *)&node_queue.field_0x1c);
    pvVar7 = vector<crnlib::vec<16U,_float>_>::operator[](&this->m_weightedVectors,v._4_4_);
    vec<16U,_float>::operator+=((vec<16U,_float> *)&ttsum,pvVar7);
    root.m_centroid.m_s._56_8_ = root.m_centroid.m_s._56_8_ + (ulong)uVar1;
    fVar12 = vec<16U,_float>::dot(pvVar5,pvVar5);
    pdVar8 = vector<double>::operator[](&this->m_weightedDotProducts,v._4_4_);
    *pdVar8 = (double)(fVar12 * (float)uVar1);
    pdVar8 = vector<double>::operator[](&this->m_weightedDotProducts,v._4_4_);
    dStack_a0 = *pdVar8 + dStack_a0;
  }
  fVar12 = vec<16U,_float>::dot((vec<16U,_float> *)&ttsum,(vec<16U,_float> *)&ttsum);
  local_288 = (float)(ulong)root.m_centroid.m_s._56_8_;
  root.m_total_weight._0_4_ = (float)(dStack_a0 - (double)(fVar12 / local_288));
  local_2a4 = (float)(ulong)root.m_centroid.m_s._56_8_;
  vec<16U,_float>::operator*=((vec<16U,_float> *)&ttsum,1.0 / local_2a4);
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::vector<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>,std::less<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>
  ::
  priority_queue<std::vector<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>,void>
            ((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::vector<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>,std::less<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>
              *)&end_node);
  splits = 0;
  local_120 = 0;
  this_00 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                      (&this->m_nodes,0);
  vq_node::operator=(this_00,(vq_node *)&ttsum);
  NodeInfo::NodeInfo((NodeInfo *)&alternative_node_queue.field_0x1c,local_120,
                     (float)root.m_total_weight);
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          *)&end_node,(value_type *)&alternative_node_queue.field_0x1c);
  local_120 = local_120 + 1;
  local_124 = 1;
  if (1 < (uint)root._96_4_) {
    while( true ) {
      local_2b1 = false;
      if (local_124 < max_splits) {
        sVar9 = std::
                priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                ::size((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                        *)&end_node);
        local_2b1 = false;
        if (sVar9 != (uint)root._96_4_) {
          local_2b1 = split_node(this,(priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                                       *)&end_node,&local_120,pTask_pool);
        }
      }
      if (local_2b1 == false) break;
      local_124 = local_124 + 1;
    }
    sVar9 = std::
            priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
            ::size((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                    *)&end_node);
    if (sVar9 == (uint)root._96_4_) {
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ::priority_queue((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                        *)&alternative_max_splits,
                       (priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                        *)&end_node);
      params.m_capacity = max_splits * 2;
      params.m_size = max_splits / (uint)root._96_4_;
      vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                *)local_178,root._96_4_);
      local_17c = 0;
      while (bVar3 = std::
                     priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                     ::empty((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                              *)&alternative_max_splits), ((bVar3 ^ 0xffU) & 1) != 0) {
        pvVar10 = std::
                  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                  ::top((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                         *)&alternative_max_splits);
        uVar4 = pvVar10->m_index;
        psVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                  ::operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                                *)local_178,local_17c);
        uVar2 = params.m_capacity;
        psVar11->main_node = uVar4;
        psVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                  ::operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                                *)local_178,local_17c);
        uVar4 = params.m_size;
        psVar11->alternative_node = uVar2;
        psVar11 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                  ::operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                                *)local_178,local_17c);
        psVar11->max_splits = uVar4;
        pData_ptr = (void *)(ulong)local_17c;
        vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
        ::operator[]((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                      *)local_178,local_17c);
        pcStack_190 = split_alternative_node_task;
        local_188 = 0;
        task_pool::
        queue_object_task<crnlib::tree_clusterizer<crnlib::vec<16u,float>>,void(crnlib::tree_clusterizer<crnlib::vec<16u,float>>::*)(unsigned_long_long,void*)>
                  (pTask_pool,this,0x1f7060,0,pData_ptr);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
               *)&alternative_max_splits);
        params.m_capacity = params.m_size * 2 + params.m_capacity;
        local_17c = local_17c + 1;
      }
      task_pool::join(pTask_pool);
      vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
      ::~vector((vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task_params>
                 *)local_178);
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ::~priority_queue((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                         *)&alternative_max_splits);
    }
  }
  while( true ) {
    local_329 = false;
    if (local_124 < max_splits) {
      local_329 = split_node(this,(priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                                   *)&end_node,&local_120,pTask_pool);
    }
    if (local_329 == false) break;
    local_124 = local_124 + 1;
  }
  for (node._4_4_ = splits; node._4_4_ < local_120; node._4_4_ = node._4_4_ + 1) {
    pvStack_1a0 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                            (&this->m_nodes,node._4_4_);
    if (((pvStack_1a0->m_alternative & 1U) != 0) || (pvStack_1a0->m_left == -1)) {
      uVar4 = vector<crnlib::vec<16U,_float>_>::size(&this->m_codebook);
      pvStack_1a0->m_codebook_index = uVar4;
      vector<crnlib::vec<16U,_float>_>::push_back(&this->m_codebook,&pvStack_1a0->m_centroid);
      if ((root._103_1_ & 1) != 0) {
        for (local_1a4 = pvStack_1a0->m_begin; local_1a4 < pvStack_1a0->m_end;
            local_1a4 = local_1a4 + 1) {
          pvVar5 = this->m_vectors;
          pVVar6 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo>::
                   operator[](&this->m_vectorsInfo,local_1a4);
          std::make_pair<crnlib::vec<16u,float>&,int&>
                    (&local_22c,pvVar5 + pVVar6->index,&pvStack_1a0->m_codebook_index);
          std::pair<crnlib::vec<16U,_float>,_unsigned_int>::pair<crnlib::vec<16U,_float>,_int,_true>
                    (&local_1e8,&local_22c);
          hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
          ::insert(&local_248,&this->m_node_index_map,&local_1e8);
        }
      }
    }
  }
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::~priority_queue((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                     *)&end_node);
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0)
        {
            m_vectors = vectors;
            m_vectorsInfo.resize(size);
            m_weightedVectors.resize(size);
            m_weightedDotProducts.resize(size);
            m_vectorsInfoLeft.resize(size);
            m_vectorsInfoRight.resize(size);
            m_vectorComparison.resize(size);
            m_nodes.resize(max_splits << 2);
            m_codebook.clear();
            uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

            vq_node root;
            root.m_begin = 0;
            root.m_end = size;
            double ttsum = 0.0f;
            for (uint i = 0; i < m_vectorsInfo.size(); i++)
            {
                const VectorType& v = vectors[i];
                m_vectorsInfo[i].index = i;
                const uint weight = m_vectorsInfo[i].weight = weights[i];
                m_weightedVectors[i] = v * (float)weight;
                root.m_centroid += m_weightedVectors[i];
                root.m_total_weight += weight;
                m_weightedDotProducts[i] = v.dot(v) * weight;
                ttsum += m_weightedDotProducts[i];
            }
            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
            root.m_centroid *= (1.0f / root.m_total_weight);

            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = 0, end_node = begin_node, splits = 0;
            m_nodes[end_node] = root;
            node_queue.push(NodeInfo(end_node, root.m_variance));
            end_node++;
            splits++;

            if (num_tasks > 1)
            {
                while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
                {
                    splits++;
                }
                if (node_queue.size() == num_tasks)
                {
                    std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
                    uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
                    crnlib::vector<split_alternative_node_task_params> params(num_tasks);
                    for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++)
                    {
                        params[task].main_node = alternative_node_queue.top().m_index;
                        params[task].alternative_node = alternative_node;
                        params[task].max_splits = alternative_max_splits;
                        pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
                    }
                    pTask_pool->join();
                }
            }

            while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
            {
                splits++;
            }

            for (uint i = begin_node; i < end_node; i++)
            {
                vq_node& node = m_nodes[i];
                if (!node.m_alternative && node.m_left != -1)
                {
                    continue;
                }
                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);
                if (generate_node_index_map)
                {
                    for (uint j = node.m_begin; j < node.m_end; j++)
                    {
                        m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
                    }
                }
            }
        }